

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenGL.cpp
# Opt level: O0

char * a__GlPrintError(int error)

{
  char *local_18;
  char *errstr;
  int error_local;
  
  local_18 = "UNKNOWN";
  if (error == 0x500) {
    local_18 = "GL_INVALID_ENUM";
  }
  else if (error == 0x501) {
    local_18 = "GL_INVALID_VALUE";
  }
  else if (error == 0x502) {
    local_18 = "GL_INVALID_OPERATION";
  }
  else if (error == 0x503) {
    local_18 = "GL_STACK_OVERFLOW";
  }
  else if (error == 0x504) {
    local_18 = "GL_STACK_UNDERFLOW";
  }
  else if (error == 0x505) {
    local_18 = "GL_OUT_OF_MEMORY";
  }
  else if (error == 0x506) {
    local_18 = "INVALID FRAMEBUFFER";
  }
  else if (error == 0x8031) {
    local_18 = "GL_TABLE_TOO_LARGE";
  }
  return local_18;
}

Assistant:

const char *a__GlPrintError(int error) {
	const char *errstr = "UNKNOWN";
	switch (error) {
	case GL_INVALID_ENUM: errstr = "GL_INVALID_ENUM"; break;
	case GL_INVALID_VALUE: errstr = "GL_INVALID_VALUE"; break;
	case GL_INVALID_OPERATION: errstr = "GL_INVALID_OPERATION"; break;
#ifdef GL_STACK_OVERFLOW
	case GL_STACK_OVERFLOW: errstr = "GL_STACK_OVERFLOW"; break;
#endif
#ifdef GL_STACK_UNDERFLOW
	case GL_STACK_UNDERFLOW: errstr = "GL_STACK_UNDERFLOW"; break;
#endif
	case GL_OUT_OF_MEMORY: errstr = "GL_OUT_OF_MEMORY"; break;
#ifdef GL_TABLE_TOO_LARGE
	case GL_TABLE_TOO_LARGE: errstr = "GL_TABLE_TOO_LARGE"; break;
#endif
	case 1286: errstr = "INVALID FRAMEBUFFER"; break;
	};
	return errstr;
}